

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# soul_heart_AST.h
# Opt level: O0

void __thiscall
soul::heart::AssignFromValue::visitExpressions(AssignFromValue *this,ExpressionVisitorFn fn)

{
  Expression *pEVar1;
  ExpressionVisitorFn fn_local;
  AssignFromValue *this_local;
  
  Assignment::visitExpressions(&this->super_Assignment,fn);
  pEVar1 = pool_ref<soul::heart::Expression>::operator->(&this->source);
  (*(pEVar1->super_Object)._vptr_Object[3])(pEVar1,fn,0);
  std::function<void_(soul::pool_ref<soul::heart::Expression>_&,_soul::AccessType)>::operator()
            (fn,&this->source,read);
  return;
}

Assistant:

void visitExpressions (ExpressionVisitorFn fn) override
        {
            Assignment::visitExpressions (fn);
            source->visitExpressions (fn, AccessType::read);
            fn (source, AccessType::read);
        }